

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_p_race(void)

{
  player_race *ppVar1;
  player_race *next;
  player_race *p;
  
  next = races;
  while (next != (player_race *)0x0) {
    ppVar1 = next->next;
    string_free(next->name);
    mem_free(next);
    next = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_p_race(void)
{
	struct player_race *p = races;
	struct player_race *next;

	while (p) {
		next = p->next;
		string_free((char *)p->name);
		mem_free(p);
		p = next;
	}
}